

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O1

edge_const_shared_ptr_t __thiscall
tchecker::syncprod::edges_iterator_t::operator*(edges_iterator_t *this)

{
  element_type *peVar1;
  shared_ptr<tchecker::system::edge_t> *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  edge_const_shared_ptr_t eVar4;
  edge_const_shared_ptr_t eVar5;
  
  peVar1 = (this->_async_edge).
           super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    psVar2 = (((this->_sync_it)._it._M_current)->super_const_iterator)._M_current;
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (psVar2->super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)in_RDI = in_RDX._M_pi;
    p_Var3 = (psVar2->super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  }
  else {
    *(element_type **)in_RDI = peVar1;
    p_Var3 = (this->_async_edge).
             super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&in_RDI->_src = p_Var3;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      eVar4.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      eVar4.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           in_RDI;
      return (edge_const_shared_ptr_t)
             eVar4.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    UNLOCK();
  }
  eVar5.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  eVar5.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (edge_const_shared_ptr_t)
         eVar5.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

tchecker::system::edge_const_shared_ptr_t edges_iterator_t::operator*()
{
  if (_async_edge.get() == nullptr)
    return *_sync_it;
  return _async_edge;
}